

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementForm.cpp
# Opt level: O2

void __thiscall Rml::ElementForm::Submit(ElementForm *this,String *name,String *submit_value)

{
  bool bVar1;
  int iVar2;
  Variant *pVVar3;
  ElementFormControl *this_00;
  type this_01;
  ulong uVar4;
  String control_name;
  ElementList form_controls;
  Dictionary values;
  String control_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  values.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (name->_M_string_length == 0) {
    pVVar3 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[7]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&values,(char (*) [7])"submit");
  }
  else {
    pVVar3 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<std::__cxx11::string_const&>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&values,name);
  }
  Variant::operator=(pVVar3,submit_value);
  form_controls.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  form_controls.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  form_controls.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&control_name,"input",(allocator<char> *)&control_value);
  ElementUtilities::GetElementsByTagName(&form_controls,&this->super_Element,&control_name);
  ::std::__cxx11::string::~string((string *)&control_name);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&control_name,"textarea",(allocator<char> *)&control_value);
  ElementUtilities::GetElementsByTagName(&form_controls,&this->super_Element,&control_name);
  ::std::__cxx11::string::~string((string *)&control_name);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&control_name,"select",(allocator<char> *)&control_value);
  ElementUtilities::GetElementsByTagName(&form_controls,&this->super_Element,&control_name);
  ::std::__cxx11::string::~string((string *)&control_name);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)form_controls.
                            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)form_controls.
                            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    this_00 = rmlui_dynamic_cast<Rml::ElementFormControl*,Rml::Element*>
                        (form_controls.
                         super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar4]);
    if (this_00 != (ElementFormControl *)0x0) {
      bVar1 = ElementFormControl::IsDisabled(this_00);
      if (!bVar1) {
        iVar2 = (*(this_00->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable
                  [0x1a])(this_00);
        if ((char)iVar2 != '\0') {
          ElementFormControl::GetName_abi_cxx11_(&control_name,this_00);
          (*(this_00->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x18])
                    (&control_value,this_00);
          if (control_name._M_string_length != 0) {
            pVVar3 = GetIf(&values,&control_name);
            if (pVVar3 == (Variant *)0x0) {
              this_01 = itlib::
                        flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                        ::operator[]<std::__cxx11::string&>
                                  ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                                    *)&values,&control_name);
              Variant::operator=(this_01,&control_value);
            }
            else {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              local_b0._M_string_length = 0;
              local_b0.field_2._M_local_buf[0] = '\0';
              Variant::Get<std::__cxx11::string>(&local_90,pVVar3,&local_b0);
              ::std::operator+(&local_70,&local_90,", ");
              ::std::operator+(&local_50,&local_70,&control_value);
              Variant::operator=(pVVar3,&local_50);
              ::std::__cxx11::string::~string((string *)&local_50);
              ::std::__cxx11::string::~string((string *)&local_70);
              ::std::__cxx11::string::~string((string *)&local_90);
              ::std::__cxx11::string::~string((string *)&local_b0);
            }
          }
          ::std::__cxx11::string::~string((string *)&control_value);
          ::std::__cxx11::string::~string((string *)&control_name);
        }
      }
    }
  }
  Element::DispatchEvent(&this->super_Element,Submit,&values);
  ::std::_Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Vector_base
            (&form_controls.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&values.m_container);
  return;
}

Assistant:

void ElementForm::Submit(const String& name, const String& submit_value)
{
	Dictionary values;
	if (name.empty())
		values["submit"] = submit_value;
	else
		values[name] = submit_value;

	ElementList form_controls;
	ElementUtilities::GetElementsByTagName(form_controls, this, "input");
	ElementUtilities::GetElementsByTagName(form_controls, this, "textarea");
	ElementUtilities::GetElementsByTagName(form_controls, this, "select");

	for (size_t i = 0; i < form_controls.size(); i++)
	{
		ElementFormControl* control = rmlui_dynamic_cast<ElementFormControl*>(form_controls[i]);
		if (!control)
			continue;

		// Skip disabled controls.
		if (control->IsDisabled())
			continue;

		// Only process controls that should be submitted.
		if (!control->IsSubmitted())
			continue;

		String control_name = control->GetName();
		String control_value = control->GetValue();

		// Skip over unnamed form controls.
		if (control_name.empty())
			continue;

		// If the item already exists, append to it.
		Variant* value = GetIf(values, control_name);
		if (value != nullptr)
			*value = value->Get<String>() + ", " + control_value;
		else
			values[control_name] = control_value;
	}

	DispatchEvent(EventId::Submit, values);
}